

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_InitCachedScope
              (Var varFunc,PropertyIdArray *propIds,Type *literalType,bool formalsAreLetDecls,
              ScriptContext *scriptContext)

{
  bool bVar1;
  _func_int **pp_Var2;
  RecyclableObject *value;
  ActivationObjectEx *this;
  code *pcVar3;
  bool bVar4;
  uint cachedFuncCount;
  uint firstFuncSlot;
  uint index;
  uint lastFuncSlot;
  JavascriptFunction *pJVar5;
  JavascriptGeneratorFunction *pJVar6;
  FunctionBody *pFVar7;
  DynamicType *pDVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  Recycler *alloc;
  ActivationObjectEx *this_00;
  int iVar11;
  Type extraAttributesSlotCount;
  ulong uVar12;
  uint i;
  undefined1 local_88 [8];
  TrackAllocData data;
  GeneratorVirtualScriptFunction *local_50;
  
  data._32_8_ = scriptContext->threadContext;
  bVar1 = ((ThreadContext *)data._32_8_)->noJsReentrancy;
  ((ThreadContext *)data._32_8_)->noJsReentrancy = true;
  bVar4 = VarIs<Js::JavascriptFunction>(varFunc);
  if (bVar4) {
    pJVar5 = VarTo<Js::JavascriptFunction>(varFunc);
    pp_Var2 = (pJVar5->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    if ((((pp_Var2 == (_func_int **)VirtualTableInfo<Js::JavascriptGeneratorFunction>::Address) ||
         (pp_Var2 ==
          (_func_int **)
          VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptGeneratorFunction>_>::Address)) ||
        (pp_Var2 == (_func_int **)VirtualTableInfo<Js::JavascriptAsyncFunction>::Address)) ||
       (pp_Var2 ==
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptAsyncFunction>_>::Address))
    {
      pJVar6 = VarTo<Js::JavascriptGeneratorFunction>(varFunc);
      local_50 = (pJVar6->scriptFunction).ptr;
      goto LAB_009a1597;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1741,"(isGAFunction)","isGAFunction");
    if (!bVar4) {
LAB_009a1837:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  local_50 = (GeneratorVirtualScriptFunction *)VarTo<Js::ScriptFunction>(varFunc);
LAB_009a1597:
  scriptContext->objectLiteralInstanceCount = scriptContext->objectLiteralInstanceCount + 1;
  if (scriptContext->objectLiteralMaxLength < propIds->count) {
    scriptContext->objectLiteralMaxLength = propIds->count;
  }
  cachedFuncCount = ActivationObjectEx::GetCachedFuncCount(propIds);
  firstFuncSlot = ActivationObjectEx::GetFirstFuncSlot(propIds);
  index = ActivationObjectEx::GetFirstVarSlot(propIds);
  if (firstFuncSlot == 0xffffffff) {
    lastFuncSlot = 0xffffffff;
  }
  else if (index == 0xffffffff || (int)index < (int)firstFuncSlot) {
    lastFuncSlot = propIds->count - 1;
  }
  else {
    lastFuncSlot = index - 1;
  }
  pDVar8 = literalType->ptr;
  if (pDVar8 == (DynamicType *)0x0) {
    pDVar8 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->activationObjectType).
             ptr;
    if (formalsAreLetDecls) {
      extraAttributesSlotCount = firstFuncSlot;
      if ((firstFuncSlot == 0xffffffff) && (extraAttributesSlotCount = index, index == 0xffffffff))
      {
        extraAttributesSlotCount = propIds->count;
      }
      pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_50);
      if ((pFVar7->field_0x17b & 2) == 0) {
        pDVar8 = PathTypeHandlerBase::CreateNewScopeObject<false>
                           (scriptContext,pDVar8,propIds,'@',extraAttributesSlotCount);
      }
      else {
        pDVar8 = PathTypeHandlerBase::CreateNewScopeObject<true>
                           (scriptContext,pDVar8,propIds,'@',extraAttributesSlotCount);
      }
    }
    else {
      pDVar8 = PathTypeHandlerBase::CreateNewScopeObject<false>
                         (scriptContext,pDVar8,propIds,'\0',0xffffffff);
    }
    Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierSet(literalType,pDVar8);
  }
  else {
    scriptContext->objectLiteralCacheCount = scriptContext->objectLiteralCacheCount + 1;
  }
  value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
          ).undefinedValue.ptr;
  this = (local_50->super_ScriptFunction).cachedScopeObj.ptr;
  if ((this == (ActivationObjectEx *)0x0) || (this->committed != true)) {
    iVar11 = cachedFuncCount - 1;
    if (cachedFuncCount == 0) {
      iVar11 = 0;
    }
    data.typeinfo = (type_info *)((long)iVar11 << 4);
    local_88 = (undefined1  [8])&ActivationObjectEx::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4d342ea;
    data.filename._0_4_ = 0x1794;
    alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_88);
    this_00 = (ActivationObjectEx *)new<Memory::Recycler>(0x48,alloc,0x37ff80,0);
    ActivationObjectEx::ActivationObjectEx
              (this_00,pDVar8,&local_50->super_ScriptFunction,cachedFuncCount,firstFuncSlot,
               lastFuncSlot);
    if (this == (ActivationObjectEx *)0x0) {
      Memory::WriteBarrierPtr<Js::ActivationObjectEx>::WriteBarrierSet
                (&(local_50->super_ScriptFunction).cachedScopeObj,this_00);
    }
    for (uVar12 = (ulong)index; uVar12 < propIds->count; uVar12 = uVar12 + 1) {
      DynamicObject::SetSlot
                ((DynamicObject *)this_00,(&propIds[1].count)[uVar12],false,(int)uVar12,value);
    }
  }
  else {
    DynamicObject::ReplaceType((DynamicObject *)this,pDVar8);
    this->committed = false;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (; this_00 = this, index < propIds->count; index = index + 1) {
      pRVar10 = (RecyclableObject *)DynamicObject::GetSlot((DynamicObject *)this,index);
      if (pRVar10 != value) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x178e,"(scopeObjEx->GetSlot(i) == undef)",
                                    "Var attached to cached scope");
        if (!bVar4) goto LAB_009a1837;
        *puVar9 = 0;
      }
    }
  }
  *(bool *)(data._32_8_ + 0x108) = bVar1;
  return this_00;
}

Assistant:

Var JavascriptOperators::OP_InitCachedScope(Var varFunc, const Js::PropertyIdArray *propIds, Field(DynamicType*)* literalType, bool formalsAreLetDecls, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_InitCachedScope, reentrancylock, scriptContext->GetThreadContext());
        bool isGAFunction = VarIs<JavascriptFunction>(varFunc);
        Assert(isGAFunction);
        if (isGAFunction)
        {
            JavascriptFunction *function = VarTo<JavascriptFunction>(varFunc);
            isGAFunction = JavascriptGeneratorFunction::Test(function) || JavascriptAsyncFunction::Test(function);
        }

        ScriptFunction *func = isGAFunction ?
            VarTo<JavascriptGeneratorFunction>(varFunc)->GetGeneratorVirtualScriptFunction() :
            VarTo<ScriptFunction>(varFunc);

#ifdef PROFILE_OBJECT_LITERALS
        // Empty objects not counted in the object literal counts
        scriptContext->objectLiteralInstanceCount++;
        if (propIds->count > scriptContext->objectLiteralMaxLength)
        {
            scriptContext->objectLiteralMaxLength = propIds->count;
        }
#endif

        PropertyId cachedFuncCount = ActivationObjectEx::GetCachedFuncCount(propIds);
        PropertyId firstFuncSlot = ActivationObjectEx::GetFirstFuncSlot(propIds);
        PropertyId firstVarSlot = ActivationObjectEx::GetFirstVarSlot(propIds);
        PropertyId lastFuncSlot = Constants::NoProperty;

        if (firstFuncSlot != Constants::NoProperty)
        {
            if (firstVarSlot == Constants::NoProperty || firstVarSlot < firstFuncSlot)
            {
                lastFuncSlot = propIds->count - 1;
            }
            else
            {
                lastFuncSlot = firstVarSlot - 1;
            }
        }

        DynamicType *type = *literalType;
        if (type != nullptr)
        {
#ifdef PROFILE_OBJECT_LITERALS
            scriptContext->objectLiteralCacheCount++;
#endif
        }
        else
        {
            type = scriptContext->GetLibrary()->GetActivationObjectType();
            if (formalsAreLetDecls)
            {
                uint formalsSlotLimit = (firstFuncSlot != Constants::NoProperty) ? (uint)firstFuncSlot :
                                        (firstVarSlot != Constants::NoProperty) ? (uint)firstVarSlot :
                                        propIds->count;
                if (func->GetFunctionBody()->HasReferenceableBuiltInArguments())
                {
                    type = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, type, propIds, PropertyLet, formalsSlotLimit);
                }
                else
                {
                    type = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, type, propIds, PropertyLet, formalsSlotLimit);
                }
            }
            else
            {
                type = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, type, propIds);
            }
            *literalType = type;
        }
        Var undef = scriptContext->GetLibrary()->GetUndefined();

        ActivationObjectEx *scopeObjEx = func->GetCachedScope();
        if (scopeObjEx && scopeObjEx->IsCommitted())
        {
            scopeObjEx->ReplaceType(type);
            scopeObjEx->SetCommit(false);
#if DBG
            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                AssertMsg(scopeObjEx->GetSlot(i) == undef, "Var attached to cached scope");
            }
#endif
        }
        else
        {
            ActivationObjectEx *tmp = RecyclerNewPlus(scriptContext->GetRecycler(), (cachedFuncCount == 0 ? 0 : cachedFuncCount - 1) * sizeof(FuncCacheEntry), ActivationObjectEx, type, func, cachedFuncCount, firstFuncSlot, lastFuncSlot);
            if (!scopeObjEx)
            {
                func->SetCachedScope(tmp);
            }
            scopeObjEx = tmp;

            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                scopeObjEx->SetSlot(SetSlotArguments(propIds->elements[i], i, undef));
            }
        }

        return scopeObjEx;
        JIT_HELPER_END(OP_InitCachedScope);
    }